

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

TaskHandle __thiscall
Task::fromJson(Task *this,int id,
              vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *operands
              ,json *json)

{
  value_t vVar1;
  long lVar2;
  json_value jVar3;
  shared_ptr<Operand> *psVar4;
  key_type *pkVar5;
  bool bVar6;
  const_reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  OperandUsage *usage;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  TaskHandle TVar11;
  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
  ins;
  anon_class_24_1_ca163648 fill;
  undefined1 local_88 [32];
  _Base_ptr local_68;
  size_t local_60;
  anon_class_24_1_ca163648 local_58;
  undefined1 local_40 [8];
  json_value local_38;
  
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Task,std::allocator<Task>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->name,(Task **)this,
             (allocator<Task> *)local_88);
  std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::vector
            (&local_58.operands,operands);
  **(int **)this = id;
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"name");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,pvVar7);
  std::__cxx11::string::operator=((string *)(*(long *)this + 8),(string *)local_88);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  lVar2 = *(long *)this;
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"ins");
  fromJson::anon_class_24_1_ca163648::operator()
            (&local_58,(vector<OperandUsage,_std::allocator<OperandUsage>_> *)(lVar2 + 0x30),pvVar7)
  ;
  lVar2 = *(long *)this;
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"outs");
  fromJson::anon_class_24_1_ca163648::operator()
            (&local_58,(vector<OperandUsage,_std::allocator<OperandUsage>_> *)(lVar2 + 0x48),pvVar7)
  ;
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"workspace");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
            (pvVar7,(unsigned_long *)local_88);
  *(undefined8 *)(*(long *)this + 0x28) = local_88._0_8_;
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"time");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
            (pvVar7,(double *)local_88);
  uVar8 = (ulong)((double)local_88._0_8_ * 1000.0);
  *(ulong *)(*(long *)this + 0x60) =
       (long)((double)local_88._0_8_ * 1000.0 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8
  ;
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"attr");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_40,pvVar7);
  lVar2 = *(long *)this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_40);
  vVar1 = *(value_t *)(lVar2 + 0xb8);
  *(value_t *)(lVar2 + 0xb8) = local_40[0];
  jVar3 = *(json_value *)(lVar2 + 0xc0);
  *(json_value *)(lVar2 + 0xc0) = local_38;
  local_40[0] = vVar1;
  local_38 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)(lVar2 + 0xb8));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_40);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_40 + 8),local_40[0]);
  local_88._24_8_ = local_88 + 8;
  local_88._8_4_ = _S_red;
  local_88._16_8_ = 0;
  local_60 = 0;
  psVar4 = *(shared_ptr<Operand> **)(*(long *)this + 0x38);
  local_68 = (_Base_ptr)local_88._24_8_;
  for (p_Var10 = *(__shared_count<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x30);
      (shared_ptr<Operand> *)p_Var10 != psVar4; p_Var10 = p_Var10 + 0xd) {
    std::
    _Rb_tree<std::shared_ptr<Operand>,std::shared_ptr<Operand>,std::_Identity<std::shared_ptr<Operand>>,std::less<std::shared_ptr<Operand>>,std::allocator<std::shared_ptr<Operand>>>
    ::_M_insert_unique<std::shared_ptr<Operand>const&>
              ((_Rb_tree<std::shared_ptr<Operand>,std::shared_ptr<Operand>,std::_Identity<std::shared_ptr<Operand>>,std::less<std::shared_ptr<Operand>>,std::allocator<std::shared_ptr<Operand>>>
                *)local_88,(shared_ptr<Operand> *)p_Var10);
  }
  lVar2 = *(long *)this;
  *(undefined1 *)(lVar2 + 0x68) = 0;
  p_Var10 = *(__shared_count<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x48);
  pkVar5 = *(key_type **)(lVar2 + 0x50);
  do {
    if ((key_type *)p_Var10 == pkVar5) {
LAB_0011a617:
      bVar6 = isForbidden(*(Task **)this);
      if (!bVar6) {
        std::
        _Rb_tree<std::shared_ptr<Operand>,_std::shared_ptr<Operand>,_std::_Identity<std::shared_ptr<Operand>_>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<Operand>,_std::shared_ptr<Operand>,_std::_Identity<std::shared_ptr<Operand>_>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                     *)local_88);
        std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::~vector
                  (&local_58.operands);
        TVar11.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        TVar11.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
        return (TaskHandle)TVar11.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
      }
      __assert_fail("not task->isForbidden()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                    ,0xcb,
                    "static TaskHandle Task::fromJson(int, const std::vector<OperandHandle> &, const nlohmann::json &)"
                   );
    }
    sVar9 = std::
            set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
            ::count((set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                     *)local_88,(key_type *)p_Var10);
    if (sVar9 != 0) {
      *(undefined1 *)(*(long *)this + 0x68) = 1;
      goto LAB_0011a617;
    }
    p_Var10 = p_Var10 + 0xd;
  } while( true );
}

Assistant:

static TaskHandle fromJson(int id, const std::vector<OperandHandle> &operands, const nlohmann::json &json) {
        auto task = std::make_shared<Task>();
        auto fill = [operands](std::vector<OperandUsage> &vec, const nlohmann::json &array) {
            vec.resize(array.size());
            // Python processor has already assumed `arch == "CUDA"`
            for (int i = 0; i < vec.size(); ++ i) {
                vec[i] = OperandUsage{ operands[static_cast<int>(array[i])] };
            }
        };

        // Fill task
        task->id = id;
        task->name = json["name"];
        fill(task->ins, json["ins"]);
        fill(task->outs, json["outs"]);
        task->workspace = json["workspace"];
        task->duration = Unit::us(static_cast<double>(json["time"]));
        task->attr = json["attr"];

        // Detect inplace
        std::set<OperandHandle> ins;
        for (auto &usage: task->ins) {
            ins.insert(usage.operand);
        }
        task->inplace = false;
        for (auto &usage: task->outs) {
            if (ins.count(usage.operand)) {
                task->inplace = true;
                break;
            }
        }

        assert(not task->isForbidden());
        return task;
    }